

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QPropertyBindingErrorPrivate>::detach_helper
          (QSharedDataPointer<QPropertyBindingErrorPrivate> *this)

{
  QPropertyBindingErrorPrivate *pQVar1;
  Data *pDVar2;
  QPropertyBindingErrorPrivate *pQVar3;
  
  pQVar3 = (QPropertyBindingErrorPrivate *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pQVar3->type = pQVar1->type;
  pDVar2 = (pQVar1->description).d.d;
  (pQVar3->description).d.d = pDVar2;
  (pQVar3->description).d.ptr = (pQVar1->description).d.ptr;
  (pQVar3->description).d.size = (pQVar1->description).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type_conflict)
       (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar1 = (this->d).ptr, pQVar1 != (QPropertyBindingErrorPrivate *)0x0)) {
    pDVar2 = (pQVar1->description).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           -1);
      UNLOCK();
      if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> ==
          0) {
        QArrayData::deallocate(&((pQVar1->description).d.d)->super_QArrayData,2,0x10);
      }
    }
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}